

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O0

optional<VariableDefinition> * __thiscall
Scope::find(optional<VariableDefinition> *__return_storage_ptr__,Scope *this,string *variableName,
           bool canCrossFunctionBarrier)

{
  bool bVar1;
  undefined1 local_58 [8];
  optional<VariableDefinition> find;
  Scope *pSStack_30;
  bool considerPartiallyBound;
  Scope *scopeToSearch;
  bool canCrossFunctionBarrier_local;
  string *variableName_local;
  Scope *this_local;
  
  find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
  super__Optional_payload<VariableDefinition,_true,_false,_false>.
  super__Optional_payload_base<VariableDefinition>._31_1_ = 0;
  pSStack_30 = this;
  do {
    findLocally((optional<VariableDefinition> *)local_58,pSStack_30,variableName,
                (bool)(find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
                       super__Optional_payload<VariableDefinition,_true,_false,_false>.
                       super__Optional_payload_base<VariableDefinition>._31_1_ & 1));
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_58);
    if (bVar1) {
      std::optional<VariableDefinition>::optional
                (__return_storage_ptr__,(optional<VariableDefinition> *)local_58);
      bVar1 = true;
    }
    else {
      bVar1 = std::operator!=(&pSStack_30->outerScope,(nullptr_t)0x0);
      if (bVar1) {
        if ((pSStack_30->outerScopeCrossesFunctionBarrier & 1U) != 0) {
          find.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
          super__Optional_payload<VariableDefinition,_true,_false,_false>.
          super__Optional_payload_base<VariableDefinition>._31_1_ = 1;
        }
        if ((canCrossFunctionBarrier) || ((pSStack_30->outerScopeCrossesFunctionBarrier & 1U) == 0))
        {
          pSStack_30 = std::__shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>::get
                                 ((__shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2> *)pSStack_30);
          bVar1 = false;
        }
        else {
          std::optional<VariableDefinition>::optional(__return_storage_ptr__);
          bVar1 = true;
        }
      }
      else {
        std::optional<VariableDefinition>::optional(__return_storage_ptr__);
        bVar1 = true;
      }
    }
    std::optional<VariableDefinition>::~optional((optional<VariableDefinition> *)local_58);
  } while (!bVar1);
  return __return_storage_ptr__;
}

Assistant:

std::optional<VariableDefinition> find(const std::string & variableName, bool canCrossFunctionBarrier) {

    Scope* scopeToSearch = this;

    bool considerPartiallyBound = false;

    while (true) {
      auto find = scopeToSearch->findLocally(variableName, considerPartiallyBound);

      if (find) {
        return find;
      }

      if (scopeToSearch->outerScope != nullptr) {
        if (scopeToSearch->outerScopeCrossesFunctionBarrier) {
          considerPartiallyBound = true;
        }

        if (!canCrossFunctionBarrier && scopeToSearch->outerScopeCrossesFunctionBarrier) {
          return std::nullopt;

        } else {
          scopeToSearch = scopeToSearch->outerScope.get();
        }
      } else {
        return std::nullopt;
      }
    }
  }